

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_flow(FLOW_HANDLE flow)

{
  AMQP_VALUE pAVar1;
  
  if (flow != (FLOW_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(flow->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_flow(FLOW_HANDLE flow)
{
    AMQP_VALUE result;

    if (flow == NULL)
    {
        result = NULL;
    }
    else
    {
        FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)flow;
        result = amqpvalue_clone(flow_instance->composite_value);
    }

    return result;
}